

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLComment::~XMLComment(XMLComment *this)

{
  XMLNode *this_00;
  char *pcVar1;
  
  (this->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_00267540;
  XMLNode::DeleteChildren(&this->super_XMLNode);
  this_00 = (this->super_XMLNode)._parent;
  if (this_00 != (XMLNode *)0x0) {
    XMLNode::Unlink(this_00,&this->super_XMLNode);
  }
  if ((((this->super_XMLNode)._value._flags & 0x200) != 0) &&
     (pcVar1 = (this->super_XMLNode)._value._start, pcVar1 != (char *)0x0)) {
    operator_delete__(pcVar1);
  }
  (this->super_XMLNode)._value._flags = 0;
  (this->super_XMLNode)._value._start = (char *)0x0;
  (this->super_XMLNode)._value._end = (char *)0x0;
  return;
}

Assistant:

XMLNode::~XMLNode()
{
    DeleteChildren();
    if ( _parent ) {
        _parent->Unlink( this );
    }
}